

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob-test.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_0::TestCase60::~TestCase60(TestCase60 *this)

{
  TestCase60 *this_local;
  
  kj::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(Blob, Data) {
  Data::Reader data = dataLit("foo");

  EXPECT_EQ(dataLit("foo"), data);
  EXPECT_EQ(3u, data.size());

  Data::Reader data2 = dataLit("bar");
  EXPECT_EQ(dataLit("bar"), data2);

  byte c[4] = "baz";
  Data::Reader data3(c, 3);
  EXPECT_EQ(dataLit("baz"), data3);

  Data::Builder builder(c, 3);
  EXPECT_EQ(dataLit("baz"), builder);

  EXPECT_EQ(dataLit("az"), builder.slice(1, 3));
}